

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O1

SynFunctionArgument * ParseFunctionArgument(ParseContext *ctx,bool lastExplicit,SynBase *lastType)

{
  uint uVar1;
  Lexeme *begin;
  char cVar2;
  bool bVar3;
  int iVar4;
  SynBase *pSVar5;
  SynBase *pSVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SynBase *this_00;
  undefined4 extraout_var_01;
  SynFunctionArgument *this_01;
  Lexeme *pLVar7;
  char *pcVar8;
  SynIdentifier *this;
  undefined4 extraout_var_02;
  
  begin = ctx->currentLexeme;
  cVar2 = ParseContext::Consume(ctx,"explicit");
  this_01 = (SynFunctionArgument *)0x0;
  pSVar5 = ParseType(ctx,(bool *)0x0,false);
  if (pSVar5 != (SynBase *)0x0) {
    pSVar6 = pSVar5;
    if ((lastType != (SynBase *)0x0) && (pLVar7 = ctx->currentLexeme, pLVar7->type != lex_string)) {
      if ((bool)cVar2) {
        pcVar8 = "ERROR: variable name not found after type in function variable list";
        goto LAB_002267cc;
      }
      ctx->currentLexeme = begin;
      pSVar6 = lastType;
      cVar2 = lastExplicit;
    }
    bVar3 = anon_unknown.dwarf_16d1cf::CheckAt
                      (ctx,lex_string,
                       "ERROR: variable name not found after type in function variable list");
    if (bVar3) {
      pLVar7 = ctx->currentLexeme;
      pcVar8 = pLVar7->pos;
      uVar1 = pLVar7->length;
      if (pLVar7->type != lex_none) {
        ctx->currentLexeme = pLVar7 + 1;
      }
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      this = (SynIdentifier *)CONCAT44(extraout_var,iVar4);
      if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_002267a6;
      pLVar7 = ctx->currentLexeme + -1;
      SynBase::SynBase((SynBase *)this,4,pLVar7,pLVar7);
      (this->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003f6178;
      (this->name).begin = pcVar8;
      (this->name).end = pcVar8 + uVar1;
    }
    else {
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      this = (SynIdentifier *)CONCAT44(extraout_var_00,iVar4);
      (this->super_SynBase).typeID = 4;
      (this->super_SynBase).begin = (Lexeme *)0x0;
      (this->super_SynBase).end = (Lexeme *)0x0;
      (this->super_SynBase).pos.begin = (char *)0x0;
      (this->super_SynBase).pos.end = (char *)0x0;
      *(undefined8 *)((long)&(this->super_SynBase).pos.end + 2) = 0;
      *(undefined8 *)((long)&(this->super_SynBase).next + 2) = 0;
      (this->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003f6178;
      (this->name).begin = (char *)0x0;
      (this->name).end = (char *)0x0;
    }
    if (ctx->currentLexeme->type == lex_set) {
      ctx->currentLexeme = ctx->currentLexeme + 1;
      this_00 = ParseTernaryExpr(ctx);
      if (this_00 == (SynBase *)0x0) {
        anon_unknown.dwarf_16d1cf::Report
                  (ctx,ctx->currentLexeme,"ERROR: default argument value not found after \'=\'");
        iVar4 = (*ctx->allocator->_vptr_Allocator[2])();
        this_00 = (SynBase *)CONCAT44(extraout_var_01,iVar4);
        SynBase::SynBase(this_00,0,ctx->currentLexeme,ctx->currentLexeme);
        this_00->_vptr_SynBase = (_func_int **)&PTR__SynBase_003f6d38;
      }
    }
    else {
      this_00 = (SynBase *)0x0;
    }
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x58);
    this_01 = (SynFunctionArgument *)CONCAT44(extraout_var_02,iVar4);
    pLVar7 = ctx->currentLexeme;
    if (begin != pLVar7) {
      if (pLVar7 <= ctx->firstLexeme) {
LAB_002267a6:
        __assert_fail("currentLexeme > firstLexeme",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                      ,0x19c,"Lexeme *ParseContext::Previous()");
      }
      pLVar7 = pLVar7 + -1;
    }
    SynBase::SynBase((SynBase *)this_01,0x36,begin,pLVar7);
    (this_01->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003f6da8;
    (this_01->super_SynBase).field_0x3a = cVar2;
    this_01->type = pSVar6;
    this_01->name = this;
    this_01->initializer = this_00;
  }
  if (cVar2 != '\x01' || pSVar5 != (SynBase *)0x0) {
    return this_01;
  }
  pLVar7 = ctx->currentLexeme;
  pcVar8 = "ERROR: type name not found after \'explicit\' specifier";
LAB_002267cc:
  anon_unknown.dwarf_16d1cf::Stop(ctx,pLVar7,pcVar8);
}

Assistant:

SynFunctionArgument* ParseFunctionArgument(ParseContext &ctx, bool lastExplicit, SynBase *lastType)
{
	Lexeme *start = ctx.currentLexeme;

	bool isExplicit = ctx.Consume("explicit");

	if(SynBase *type = ParseType(ctx))
	{
		if(!ctx.At(lex_string) && lastType)
		{
			if(isExplicit)
				Stop(ctx, ctx.Current(), "ERROR: variable name not found after type in function variable list");

			// Backtrack
			ctx.currentLexeme = start;

			isExplicit = lastExplicit;
			type = lastType;
		}

		SynIdentifier *nameIdentifier = NULL;

		if(CheckAt(ctx, lex_string, "ERROR: variable name not found after type in function variable list"))
		{
			InplaceStr name = ctx.Consume();
			nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);
		}
		else
		{
			nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr());
		}

		SynBase *initializer = NULL;

		if(ctx.Consume(lex_set))
		{
			initializer = ParseTernaryExpr(ctx);

			if(!initializer)
			{
				Report(ctx, ctx.Current(), "ERROR: default argument value not found after '='");

				initializer = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
			}
		}

		return new (ctx.get<SynFunctionArgument>()) SynFunctionArgument(start, start == ctx.currentLexeme ? ctx.Current() : ctx.Previous(), isExplicit, type, nameIdentifier, initializer);
	}

	if(isExplicit)
		Stop(ctx, ctx.Current(), "ERROR: type name not found after 'explicit' specifier");

	return NULL;
}